

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameParseSql(Parse *p,char *zDb,int bTable,sqlite3 *db,char *zSql,int bTemp)

{
  undefined1 uVar1;
  int iVar2;
  long in_RCX;
  int in_EDX;
  long *in_RDI;
  int in_R9D;
  char *zErr;
  int rc;
  char **in_stack_00000970;
  char *in_stack_00000978;
  Parse *in_stack_00000980;
  undefined1 local_3c;
  long lVar3;
  uint in_stack_ffffffffffffffd0;
  
  lVar3 = 0;
  if (in_R9D == 0) {
    iVar2 = sqlite3FindDbName((sqlite3 *)(ulong)in_stack_ffffffffffffffd0,(char *)0x0);
    local_3c = (undefined1)iVar2;
  }
  else {
    local_3c = 1;
  }
  *(undefined1 *)(in_RCX + 0xb4) = local_3c;
  memset(in_RDI,0,0x198);
  uVar1 = 2;
  if (in_EDX != 0) {
    uVar1 = 3;
  }
  *(undefined1 *)((long)in_RDI + 0x10c) = uVar1;
  *in_RDI = in_RCX;
  *(undefined4 *)((long)in_RDI + 0xb4) = 1;
  iVar2 = sqlite3RunParser(in_stack_00000980,in_stack_00000978,in_stack_00000970);
  in_RDI[1] = lVar3;
  if (*(char *)(in_RCX + 0x61) != '\0') {
    iVar2 = 7;
  }
  if ((((iVar2 == 0) && (in_RDI[0x27] == 0)) && (in_RDI[0x28] == 0)) && (in_RDI[0x29] == 0)) {
    iVar2 = sqlite3CorruptError(0);
  }
  *(undefined1 *)(in_RCX + 0xb4) = 0;
  return iVar2;
}

Assistant:

static int renameParseSql(
  Parse *p,                       /* Memory to use for Parse object */
  const char *zDb,                /* Name of schema SQL belongs to */
  int bTable,                     /* 1 -> RENAME TABLE, 0 -> RENAME COLUMN */
  sqlite3 *db,                    /* Database handle */
  const char *zSql,               /* SQL to parse */
  int bTemp                       /* True if SQL is from temp schema */
){
  int rc;
  char *zErr = 0;

  db->init.iDb = bTemp ? 1 : sqlite3FindDbName(db, zDb);

  /* Parse the SQL statement passed as the first argument. If no error
  ** occurs and the parse does not result in a new table, index or
  ** trigger object, the database must be corrupt. */
  memset(p, 0, sizeof(Parse));
  p->eParseMode = (bTable ? PARSE_MODE_RENAME_TABLE : PARSE_MODE_RENAME_COLUMN);
  p->db = db;
  p->nQueryLoop = 1;
  rc = sqlite3RunParser(p, zSql, &zErr);
  assert( p->zErrMsg==0 );
  assert( rc!=SQLITE_OK || zErr==0 );
  assert( (0!=p->pNewTable) + (0!=p->pNewIndex) + (0!=p->pNewTrigger)<2 );
  p->zErrMsg = zErr;
  if( db->mallocFailed ) rc = SQLITE_NOMEM;
  if( rc==SQLITE_OK 
   && p->pNewTable==0 && p->pNewIndex==0 && p->pNewTrigger==0 
  ){
    rc = SQLITE_CORRUPT_BKPT;
  }

#ifdef SQLITE_DEBUG
  /* Ensure that all mappings in the Parse.pRename list really do map to
  ** a part of the input string.  */
  if( rc==SQLITE_OK ){
    int nSql = sqlite3Strlen30(zSql);
    RenameToken *pToken;
    for(pToken=p->pRename; pToken; pToken=pToken->pNext){
      assert( pToken->t.z>=zSql && &pToken->t.z[pToken->t.n]<=&zSql[nSql] );
    }
  }
#endif

  db->init.iDb = 0;
  return rc;
}